

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O1

bool __thiscall neueda::cdr::getInteger(cdr *this,cdrKey_t *key,int32_t *value)

{
  bool bVar1;
  int64_t tmp;
  long local_10;
  
  bVar1 = getInteger(this,key,&local_10);
  if ((bVar1) && ((int)local_10 == local_10)) {
    *value = (int)local_10;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
cdr::getInteger (const cdrKey_t& key, int32_t& value) const
{
    int64_t tmp;
    if (!getInteger (key, tmp))
        return false;
    if (tmp < INT32_MIN || tmp > INT32_MAX)
        return false;
    value = tmp;
    return true;
}